

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

int Abc_NodeIsAnd2(Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pNtk_00;
  Mio_Gate_t *pMVar1;
  int iVar2;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar3;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pNode_local;
  
  pNtk_00 = pNode->pNtk;
  iVar2 = Abc_NtkIsNetlist(pNtk_00);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                  ,0x388,"int Abc_NodeIsAnd2(Abc_Obj_t *)");
  }
  iVar2 = Abc_ObjIsNode(pNode);
  if (iVar2 != 0) {
    iVar2 = Abc_ObjFaninNum(pNode);
    if (iVar2 == 2) {
      iVar2 = Abc_NtkHasSop(pNtk_00);
      if (iVar2 == 0) {
        iVar2 = Abc_NtkHasMapping(pNtk_00);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                        ,0x390,"int Abc_NodeIsAnd2(Abc_Obj_t *)");
        }
        pMVar1 = (Mio_Gate_t *)(pNode->field_5).pData;
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        pMVar3 = Mio_LibraryReadAnd2(pLib);
        pNode_local._4_4_ = (uint)(pMVar1 == pMVar3);
      }
      else {
        pNode_local._4_4_ = Abc_SopIsAndType((char *)(pNode->field_5).pData);
      }
    }
    else {
      pNode_local._4_4_ = 0;
    }
    return pNode_local._4_4_;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                ,0x389,"int Abc_NodeIsAnd2(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeIsAnd2( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    if ( Abc_ObjFaninNum(pNode) != 2 )
        return 0;
    if ( Abc_NtkHasSop(pNtk) )
    return Abc_SopIsAndType(((char *)pNode->pData));
    if ( Abc_NtkHasMapping(pNtk) )
        return pNode->pData == (void *)Mio_LibraryReadAnd2((Mio_Library_t *)Abc_FrameReadLibGen());
    assert( 0 );
    return 0;
}